

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatted_exporters.cpp
# Opt level: O3

string * generate_json_single_tree
                   (string *__return_storage_ptr__,IsoForest *model_outputs,
                   ExtIsoForest *model_outputs_ext,TreesIndexer *indexer,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *numeric_colnames,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *categ_colnames,
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *categ_levels,bool output_tree_num,bool index1,size_t tree_num)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> local_60;
  size_t *terminal_node_mappings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_68 = categ_colnames;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  if (interrupt_switch == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_88.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_88._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_88._M_string_length;
  }
  else {
    terminal_node_mappings = (size_t *)0x0;
    local_60._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
         (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
    get_tree_mappings(&terminal_node_mappings,
                      (unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                      &local_60,model_outputs,model_outputs_ext,indexer,tree_num);
    if (model_outputs == (IsoForest *)0x0) {
      traverse_ext_json(&local_88,0,model_outputs_ext,
                        (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + tree_num,terminal_node_mappings,
                        numeric_colnames,local_68,categ_levels,output_tree_num,index1,tree_num);
    }
    else {
      traverse_isoforest_json
                (&local_88,0,model_outputs,
                 (model_outputs->trees).
                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + tree_num,terminal_node_mappings,
                 numeric_colnames,local_68,categ_levels,output_tree_num,index1,tree_num);
    }
    if (interrupt_switch == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == &local_88.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_88.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_88._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_88._M_string_length;
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      std::operator+(&local_50,"{",&local_88);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        lVar1 = plVar2[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      }
      __return_storage_ptr__->_M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_60._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
        .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0) {
      operator_delete__((void *)local_60._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generate_json_single_tree(const IsoForest *model_outputs,
                                      const ExtIsoForest *model_outputs_ext,
                                      const TreesIndexer *indexer,
                                      const std::vector<std::string> &numeric_colnames,
                                      const std::vector<std::string> &categ_colnames,
                                      const std::vector<std::vector<std::string>> &categ_levels,
                                      bool output_tree_num, bool index1, size_t tree_num)
{
    std::string json_str("");
    if (interrupt_switch) return json_str;

    const size_t *restrict terminal_node_mappings = nullptr;
    std::unique_ptr<size_t[]> terminal_node_mappings_holder(nullptr);
    get_tree_mappings(
        terminal_node_mappings,
        terminal_node_mappings_holder,
        model_outputs,
        model_outputs_ext,
        indexer,
        tree_num
    );

    if (model_outputs)
    {
        traverse_isoforest_json(
            json_str, 0,
            *model_outputs, model_outputs->trees[tree_num],
            terminal_node_mappings,
            numeric_colnames,
            categ_colnames,
            categ_levels,
            output_tree_num, index1, tree_num
        );
    }

    else
    {
        traverse_ext_json(
            json_str, 0,
            *model_outputs_ext, model_outputs_ext->hplanes[tree_num],
            terminal_node_mappings,
            numeric_colnames,
            categ_colnames,
            categ_levels,
            output_tree_num, index1, tree_num
        );
    }

    if (interrupt_switch) return json_str;

    return
        "{" +
        json_str +
        "}";
}